

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcryptographichash.cpp
# Opt level: O0

void __thiscall QCryptographicHash::QCryptographicHash(QCryptographicHash *this,Algorithm method)

{
  QCryptographicHashPrivate *this_00;
  undefined8 *in_RDI;
  Algorithm in_stack_ffffffffffffffdc;
  
  this_00 = (QCryptographicHashPrivate *)operator_new(0x1f0);
  QCryptographicHashPrivate::QCryptographicHashPrivate(this_00,in_stack_ffffffffffffffdc);
  *in_RDI = this_00;
  return;
}

Assistant:

QCryptographicHash::QCryptographicHash(Algorithm method)
    : d(new QCryptographicHashPrivate{method})
{
}